

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end.c
# Opt level: O1

void done(int how)

{
  boolean bVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  long umoney;
  char *pcVar5;
  short sVar6;
  char *pcVar7;
  bool bVar8;
  char pbuf [256];
  obj *local_140;
  char local_138 [264];
  
  if (how == 0x11) {
LAB_001954f3:
    killer_format = 2;
  }
  else {
    if (how == 0xd) {
      if (killer != (char *)0x0) {
        paniclog("trickery",killer);
        killer = (char *)0x0;
      }
      if (flags.debug != '\0') {
        pline("You are a very tricky wizard, it seems.");
        return;
      }
    }
    if ((how == 10) && (killer == (char *)0x0)) goto LAB_001954f3;
  }
  if (killer == (char *)0x0) {
    if ((how == 5) || (how == 3)) {
      killer_format = 1;
    }
LAB_00195538:
    pcVar7 = deaths_rel + *(int *)(deaths_rel + (long)how * 4);
  }
  else {
    pcVar7 = killer;
    if (((uint)how < 0x10) && ((0xb000U >> (how & 0x1fU) & 1) != 0)) goto LAB_00195538;
  }
  strcpy(killbuf,pcVar7);
  killer = killbuf;
  if ((how < 0xc) && (u.umortality = u.umortality + 1, u.uprops[0x2b].extrinsic != 0)) {
    pline("But wait...");
    discover_object(0xca,'\x01','\x01');
    if ((u.uprops[0x1e].intrinsic == 0) &&
       (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
        (((youmonst.data)->mflags1 & 0x1000) == 0)))) {
      pcVar7 = "begins to glow";
    }
    else if (ublindf == (obj *)0x0) {
      pcVar7 = "feels warm";
    }
    else {
      pcVar7 = "feels warm";
      if (ublindf->oartifact == '\x1d') {
        pcVar7 = "begins to glow";
      }
    }
    pline("Your medallion %s!",pcVar7);
    if (((uamul == (obj *)0x0) || ((uamul->field_0x4a & 1) == 0)) ||
       (uVar3 = mt_random(), (uVar3 & 3) != 0)) {
      if (how == 0xb) {
        pcVar7 = "You reconstitute!";
      }
      else {
        if (how == 1) {
          pline("You vomit ...");
        }
        pcVar7 = "You feel much better!";
      }
      pline(pcVar7);
      pline("The medallion crumbles to dust!");
      if (uamul != (obj *)0x0) {
        useup(uamul);
      }
      adjattrib(4,-1,'\0',1);
      if (u.uhpmax < 1) {
        u.uhpmax = 10;
      }
      savelife(how);
      if ((how != 10) || (bVar1 = is_playermon_genocided(), bVar1 == '\0')) {
        pcVar7 = "were saved from death by your amulet of life saving!";
        goto LAB_001957e7;
      }
      pline("Unfortunately you are still genocided...");
    }
    else {
      pcVar7 = surface((int)u.ux,(int)u.uy);
      pline("But... the chain on your medallion breaks and it falls to the %s!",pcVar7);
      You_hear("homeric laughter!");
      useup(uamul);
    }
  }
  if (((how < 0xc) && (flags.explore != '\0' || flags.debug != '\0')) &&
     (cVar2 = yn_function("Die?","yn",'n'), cVar2 != 'y')) {
    pcVar7 = "die";
    if (how == 0xb) {
      pcVar7 = "disintegrate";
    }
    pcVar5 = "choke";
    if (how != 1) {
      pcVar5 = pcVar7;
    }
    pline("OK, so you don\'t %s.",pcVar5);
    if (u.uhpmax < 1) {
      u.uhpmax = u.ulevel << 3;
    }
    savelife(how);
    pcVar7 = "were saved from death by your wizard powers!";
LAB_001957e7:
    killer = (char *)0x0;
    killer_format = 0;
    historic_event('\0',pcVar7);
    return;
  }
  if ((program_state.viewing != 0) || (program_state.gameover = 1, how == 0xc)) {
    terminate();
  }
  log_command_result();
  iflags.vision_inited = '\0';
  inven_inuse('\x01');
  if ((how < 0xc) && (moves < 2)) {
    pcVar7 = currency(200);
    pline("Do not pass go.  Do not collect 200 %s.",pcVar7);
  }
  if (how < 10) {
    bVar1 = can_make_bones(&u.uz);
    bVar8 = bVar1 != '\0';
  }
  else {
    bVar8 = false;
  }
  if (how == 9) {
    u.ugrave_arise = 0xd7;
  }
  if ((bool)(u.ugrave_arise < 0 & bVar8)) {
    if (how == 8) {
      u.ugrave_arise = -2;
    }
    else if (how == 5) {
      u.ugrave_arise = -3;
    }
    else if ((u.ugrave_arise == -1) && ((mvitals[u.umonnum].mvflags & 0x10) == 0)) {
      iVar4 = u.umonnum;
      if (u.umonnum == u.umonster) {
        sVar6 = urace.femalenum;
        if (urace.femalenum == -1) {
          sVar6 = urace.malenum;
        }
        if (flags.female == '\0') {
          sVar6 = urace.malenum;
        }
        iVar4 = (int)sVar6;
      }
      local_140 = mk_named_object(0x10e,mons + iVar4,(int)u.ux,(int)u.uy,plname);
      if (killer_format == 2) {
        pcVar7 = "";
      }
      else {
        pcVar7 = killed_by_prefix[how];
      }
      pcVar5 = killer;
      if (killer_format == 0) {
        pcVar5 = an(killer);
      }
      sprintf(local_138,"%s, %s%s",plname,pcVar7,pcVar5);
      make_grave(level,(int)u.ux,(int)u.uy,local_138);
      goto LAB_0019597f;
    }
  }
  local_140 = (obj *)0x0;
LAB_0019597f:
  iVar4 = logfile;
  if (how == 0xe) {
    killer_format = 2;
    how = 0xe;
    if (u.uhp < 1) {
      u.umortality = u.umortality + 1;
      builtin_strncpy(killbuf,"quit while already on Charon\'s boat",0x24);
      how = 0;
    }
  }
  if (how - 0xfU < 2) {
    killer_format = 2;
  }
  log_finish(LS_DONE);
  write_log_toptenentry(iVar4,how);
  program_state.something_worth_saving = 0;
  uVar3 = 0xffffffff;
  if (how != 0xf) {
    uVar3 = (uint)(how != 0xe);
  }
  bVar1 = paybill(uVar3);
  paygd();
  clearpriests();
  (*windowprocs.win_pause)(P_MESSAGE);
  if (how < 0xc) {
    check_tutorial_message(0x167);
  }
  if (flags.end_disclose != '-') {
    disclose(how,bVar1);
  }
  pcVar7 = begin_dump(how);
  dump_disclose(how);
  if ((bool)(bVar1 != '\0' & bVar8)) {
    finish_paybill();
  }
  umoney = calc_score(how);
  if ((bVar8) &&
     ((flags.debug == '\0' ||
      ((program_state.stopprint == 0 && (cVar2 = yn_function("Save bones?","yn",'n'), cVar2 == 'y'))
      )))) {
    savebones(local_140);
  }
  done_money = (int)umoney;
  end_dump(how,killbuf,local_138,umoney);
  display_rip(how,killbuf,local_138,umoney);
  pcVar5 = "";
  if (pcVar7 != (char *)0x0) {
    pcVar5 = pcVar7;
  }
  update_topten(how,pcVar5);
  terminate();
}

Assistant:

void done(int how)
{
	int fd;
	boolean taken;
	char pbuf[BUFSZ];
	boolean bones_ok;
	struct obj *corpse = NULL;
	long umoney;
	const char *dumpname;

	if (check_survival(how, killbuf))
	    return;
	
	/* replays are done here: no dumping or high-score calculation required */
	if (program_state.viewing)
	    terminate();
	
	/*
	 *	The game is now over...
	 */
	program_state.gameover = 1;
	
	/* don't do the whole post-game dance if the game exploded */
	if (how == PANICKED)
	    terminate();
	
	log_command_result();
	/* render vision subsystem inoperative */
	iflags.vision_inited = 0;
	/* might have been killed while using a disposable item, so make sure
	   it's gone prior to inventory disclosure and creation of bones data */
	inven_inuse(TRUE);

	/* Sometimes you die on the first move.  Life's not fair.
	 * On those rare occasions you get hosed immediately, go out
	 * smiling... :-)  -3.
	 */
	if (moves <= 1 && how < PANICKED)	/* You die... --More-- */
	    pline("Do not pass go.  Do not collect 200 %s.", currency(200L));

	bones_ok = (how < GENOCIDED) && can_make_bones(&u.uz);

	if (how == TURNED_SLIME)
	    u.ugrave_arise = PM_GREEN_SLIME;

	if (bones_ok && u.ugrave_arise < LOW_PM) {
	    /* corpse gets burnt up too */
	    if (how == BURNING)
		u.ugrave_arise = (NON_PM - 2);	/* leave no corpse */
	    else if (how == STONING)
		u.ugrave_arise = (NON_PM - 1);	/* statue instead of corpse */
	    else if (u.ugrave_arise == NON_PM &&
		     !(mvitals[u.umonnum].mvflags & G_NOCORPSE)) {
		int mnum = u.umonnum;

		if (!Upolyd) {
		    /* Base corpse on race when not poly'd since original
		     * u.umonnum is based on role, and all role monsters
		     * are human.
		     */
		    mnum = (flags.female && urace.femalenum != NON_PM) ?
			urace.femalenum : urace.malenum;
		}
		corpse = mk_named_object(CORPSE, &mons[mnum],
				       u.ux, u.uy, plname);
		sprintf(pbuf, "%s, %s%s", plname,
			killer_format == NO_KILLER_PREFIX ? "" :
			killed_by_prefix[how],
			killer_format == KILLED_BY_AN ? an(killer) : killer);
		make_grave(level, u.ux, u.uy, pbuf);
	    }
	}

	if (how == QUIT) {
		killer_format = NO_KILLER_PREFIX;
		if (u.uhp < 1) {
			how = DIED;
			u.umortality++;	/* skipped above when how==QUIT */
			/* note that killer is pointing at killbuf */
			strcpy(killbuf, "quit while already on Charon's boat");
		}
	}
	if (how == ESCAPED || how == DEFIED)
		killer_format = NO_KILLER_PREFIX;
	
	fd = logfile;
	log_finish(LS_DONE);
	/* write_log_toptenentry needs killer_format */
	write_log_toptenentry(fd, how);
	/* in case of a subsequent panic(), there's no point trying to save */
	program_state.something_worth_saving = 0;

	/* these affect score and/or bones, but avoid them during panic */
	taken = paybill((how == ESCAPED) ? -1 : (how != QUIT));
	paygd();
	clearpriests();

	win_pause_output(P_MESSAGE);

	if (how < PANICKED)
	    check_tutorial_message(QT_T_DEATH);

	if (flags.end_disclose != DISCLOSE_NO_WITHOUT_PROMPT)
	    disclose(how, taken);

	dumpname = begin_dump(how);
	dump_disclose(how);
	
	/* finish_paybill should be called after disclosure but before bones */
	if (bones_ok && taken) finish_paybill();

	/* calculate score, before creating bones [container gold] */
	umoney = calc_score(how);

	if (bones_ok) {
	    if (!wizard || (!done_stopprint && yn("Save bones?") == 'y'))
		savebones(corpse);
	    /* corpse may be invalid pointer now so
		ensure that it isn't used again */
	    corpse = NULL;
	}

	/* update gold for the rip output, which can't use hidden_gold()
	   (containers will be gone by then if bones just got saved...) */
	done_money = umoney;

	end_dump(how, killbuf, pbuf, umoney);
	display_rip(how, killbuf, pbuf, umoney);

	/* generate a topten entry for this game.
	   update_topten does not display anything. */
	update_topten(how, dumpname ? dumpname : "");

	terminate();
}